

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CopyResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::CopyPrefix
          (CordRepBtree *this,size_t n,bool allow_folding)

{
  RefcountAndFlags *pRVar1;
  byte bVar2;
  ulong uVar3;
  CordRep *pCVar4;
  CordRepBtree *pCVar5;
  CordRepBtree *this_00;
  CordRepBtree *pCVar6;
  uint uVar7;
  char cVar8;
  size_t index;
  size_t n_00;
  Position PVar9;
  CopyResult CVar10;
  uint local_3c;
  
  if (n == 0) {
    __assert_fail("n > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x2f7,"CopyResult absl::cord_internal::CordRepBtree::CopyPrefix(size_t, bool)");
  }
  uVar3 = (this->super_CordRep).length;
  if (uVar3 < n) {
    __assert_fail("n <= this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x2f8,"CopyResult absl::cord_internal::CordRepBtree::CopyPrefix(size_t, bool)");
  }
  uVar7 = (uint)(this->super_CordRep).storage[0];
  if (allow_folding) {
    bVar2 = (this->super_CordRep).storage[1];
    while (pCVar4 = this->edges_[bVar2], n <= pCVar4->length) {
      if ((int)uVar7 < 1) {
        LOCK();
        (pCVar4->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar4->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        this_00 = (CordRepBtree *)anon_unknown_0::MakeSubstring(pCVar4,0,n);
        uVar7 = 0xffffffff;
        goto LAB_00302a00;
      }
      uVar7 = uVar7 - 1;
      this = CordRep::btree(pCVar4);
      bVar2 = (this->super_CordRep).storage[1];
    }
    uVar3 = (this->super_CordRep).length;
  }
  if (uVar3 == n) {
    LOCK();
    pRVar1 = &(this->super_CordRep).refcount;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + 2;
    UNLOCK();
    this_00 = this;
  }
  else {
    PVar9 = IndexOf(this,n);
    this_00 = CopyBeginTo(this,PVar9.index,n);
    pCVar6 = this_00;
    local_3c = uVar7;
    while( true ) {
      n_00 = PVar9.n;
      index = PVar9.index;
      if (n_00 == 0) break;
      pCVar4 = Edge(this,index);
      cVar8 = (char)PVar9.index;
      if ((int)local_3c < 1) {
        pCVar4 = CordRep::Ref(pCVar4);
        pCVar4 = anon_unknown_0::MakeSubstring(pCVar4,0,n_00);
        pCVar6->edges_[index] = pCVar4;
        index = (size_t)(byte)(cVar8 + 1);
        break;
      }
      local_3c = local_3c - 1;
      this = CordRep::btree(pCVar4);
      PVar9 = IndexOf(this,n_00);
      pCVar5 = CopyBeginTo(this,PVar9.index,n_00);
      pCVar6->edges_[index] = &pCVar5->super_CordRep;
      (pCVar6->super_CordRep).storage[2] = cVar8 + '\x01';
      pCVar6 = pCVar5;
    }
    (pCVar6->super_CordRep).storage[2] = (uint8_t)index;
    pCVar6 = CordRep::btree(&this_00->super_CordRep);
    AssertValid(pCVar6,true);
  }
LAB_00302a00:
  CVar10.height = uVar7;
  CVar10.edge = &this_00->super_CordRep;
  CVar10._12_4_ = 0;
  return CVar10;
}

Assistant:

CopyResult CordRepBtree::CopyPrefix(size_t n, bool allow_folding) {
  assert(n > 0);
  assert(n <= this->length);

  // As long as `n` does not exceed the length of the first edge, we can 'drop'
  // the current depth. For the most extreme example: if we'd copy a 1 byte
  // prefix from a tree, there is only a single edge / path from the top of the
  // tree to the single data edge containing this byte, so we can drop all the
  // nodes except the data node.
  int height = this->height();
  CordRepBtree* node = this;
  CordRep* front = node->Edge(kFront);
  if (allow_folding) {
    while (front->length >= n) {
      if (--height < 0) return {MakeSubstring(CordRep::Ref(front), 0, n), -1};
      node = front->btree();
      front = node->Edge(kFront);
    }
  }
  if (node->length == n) return {CordRep::Ref(node), height};

  // `n` spans at least two nodes, find the end point of the span.
  Position pos = node->IndexOf(n);

  // Create a partial copy of the node up to `pos.index`, with a defined length
  // of `n`. Any 'partial last edge' is added further below as needed.
  CordRepBtree* sub = node->CopyBeginTo(pos.index, n);
  const CopyResult result = {sub, height};

  // `pos.n` contains the 'offset inside the edge for IndexOf(n)'. As long as
  // this is not zero, we don't have a 'clean cut', so we need to make a
  // (partial) copy of that last edge, and repeat this until pos.n is zero.
  while (pos.n != 0) {
    size_t end = pos.index;
    n = pos.n;

    CordRep* edge = node->Edge(pos.index);
    if (--height < 0) {
      sub->edges_[end++] = MakeSubstring(CordRep::Ref(edge), 0, n);
      sub->set_end(end);
      AssertValid(result.edge->btree());
      return result;
    }

    node = edge->btree();
    pos = node->IndexOf(n);
    CordRepBtree* nsub = node->CopyBeginTo(pos.index, n);
    sub->edges_[end++] = nsub;
    sub->set_end(end);
    sub = nsub;
  }
  sub->set_end(pos.index);
  AssertValid(result.edge->btree());
  return result;
}